

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

bool __thiscall QWidget::event(QWidget *this,QEvent *event)

{
  QWidgetData **ppQVar1;
  undefined1 *puVar2;
  uchar uVar3;
  ushort uVar4;
  uint uVar5;
  QWidgetPrivate *this_00;
  QWidgetData *pQVar6;
  QWidget *pQVar7;
  QObject *pQVar8;
  QWExtra *pQVar9;
  tuple<QTLWExtra_*,_std::default_delete<QTLWExtra>_> tVar10;
  __uniq_ptr_data<QTLWExtra,_std::default_delete<QTLWExtra>,_true,_true> _Var11;
  char *pcVar12;
  char cVar13;
  undefined1 uVar14;
  quint16 qVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  QPalette *pQVar19;
  QWidget *pQVar20;
  long *plVar21;
  WId id;
  QStyle *pQVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  uint i;
  QVariant *__s1;
  long lVar26;
  undefined8 uVar27;
  uint uVar28;
  long lVar29;
  QVariant *__s1_00;
  QInputMethodQueryEvent *query;
  QArrayData *pQVar30;
  long in_FS_OFFSET;
  undefined1 auVar31 [16];
  QStatusTipEvent tip;
  QPoint local_90;
  anon_union_24_3_e3d07ef4_for_data local_88;
  undefined1 *puStack_70;
  undefined1 *local_68;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetPrivate **)&this->field_0x8;
  pQVar6 = this->data;
  uVar18 = pQVar6->widget_attributes;
  uVar4 = *(ushort *)(event + 8);
  if ((uVar18 & 1) != 0) {
    uVar14 = 0;
    if (((uVar4 - 2 < 6) ||
        ((uVar4 - 0x1f < 0x3f && ((0x6108000000000001U >> ((ulong)(uVar4 - 0x1f) & 0x3f) & 1) != 0))
        )) || ((uVar4 - 0xc2 < 0x10 && (uVar14 = 0, (0x8007U >> (uVar4 - 0xc2 & 0x1f) & 1) != 0))))
    goto switchD_0030a44e_caseD_33;
  }
  uVar14 = 1;
  if (0xa9 < uVar4) {
    switch(uVar4) {
    case 0xc2:
    case 0xc3:
    case 0xc4:
    case 0xc6:
    case 0xd1:
      goto switchD_0030a4c6_caseD_c2;
    case 0xc5:
    case 199:
    case 200:
    case 0xc9:
    case 0xca:
    case 0xcb:
    case 0xcc:
    case 0xcd:
    case 0xce:
    case 0xd0:
    case 0xd3:
    case 0xd4:
    case 0xd6:
    case 0xd7:
    case 0xda:
    case 0xdc:
    case 0xdd:
      goto switchD_0030a44e_caseD_f;
    case 0xcf:
      uVar18 = *(uint *)(event + 0x10);
      iVar16 = 0;
      do {
        uVar28 = 1 << ((byte)iVar16 & 0x1f) & uVar18;
        if (uVar28 != 0) {
          local_88._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
          puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
          local_88.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
          local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          (**(code **)(*(long *)this + 400))(&local_88,this,uVar28);
          if (((uVar28 == 1) && (puStack_70 < (undefined1 *)0x4)) &&
             (uVar5 = this->data->widget_attributes, (uVar5 & 1) == 0)) {
            ::QVariant::QVariant((QVariant *)&local_58,(bool)((byte)(uVar5 >> 0xe) & 1));
            ::QVariant::operator=((QVariant *)&local_88,(QVariant *)&local_58);
            ::QVariant::~QVariant((QVariant *)&local_58);
          }
          QInputMethodQueryEvent::setValue((InputMethodQuery)event,(QVariant *)(ulong)uVar28);
          ::QVariant::~QVariant((QVariant *)&local_88);
        }
        iVar16 = iVar16 + 1;
      } while (iVar16 != 0x20);
      event[0xc] = (QEvent)0x1;
      goto LAB_0030aafb;
    case 0xd2:
    case 0xdb:
      goto switchD_0030a44e_caseD_15;
    case 0xd5:
      pQVar20 = this;
      if (-1 < (short)uVar18) break;
      do {
        ppQVar1 = &pQVar20->data;
        pQVar20 = *(QWidget **)(*(long *)&pQVar20->field_0x8 + 0x10);
        if (pQVar20 == (QWidget *)0x0) break;
      } while ((((*ppQVar1)->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
                super_QFlagsStorage<Qt::WindowType>.i & 1) == 0);
      if (((*ppQVar1)->field_0x10 & 1) != 0) break;
      event[0xc] = (QEvent)0x1;
      goto switchD_0030a44e_caseD_7f;
    case 0xd8:
      pQVar9 = (this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>.
               _M_t.super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
               super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
      if ((pQVar9 != (QWExtra *)0x0) &&
         (tVar10.super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
          super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl =
               *(_Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_> *)
                &(pQVar9->topextra)._M_t.
                 super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>,
         tVar10.super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
         super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl !=
         (_Head_base<0UL,_QTLWExtra_*,_false>)0x0)) {
        if ((*(long *)((long)tVar10.
                             super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                             super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0x20) == 0) ||
           (lVar24 = QWindow::handle(), lVar24 == 0)) {
          id = 0;
        }
        else {
          plVar21 = (long *)QWindow::handle();
          id = (**(code **)(*plVar21 + 0x68))(plVar21);
        }
        QWidgetPrivate::setWinId(this_00,id);
      }
      break;
    case 0xd9:
      if (*(int *)(event + 0x10) == 1) {
        if ((this_00->high_attributes[0] & 0x10000000) != 0) {
          destroy(this,false,false);
        }
      }
      else if ((*(int *)(event + 0x10) == 0) && ((this_00->high_attributes[0] & 0x10000000) == 0)) {
        create(this,0,false,false);
      }
      break;
    case 0xde:
      iVar16 = *(int *)(*(long *)&(this_00->data).fnt + 0x78);
      iVar17 = (**(code **)(*(long *)&this->super_QPaintDevice + 0x20))(&this->super_QPaintDevice,8)
      ;
      if (iVar16 != iVar17) {
        QWidgetPrivate::updateFont(this_00,&(this_00->data).fnt);
      }
      this_00->field_0x253 = this_00->field_0x253 | 8;
      break;
    default:
      if (uVar4 - 0xb1 < 2) goto switchD_0030a44e_caseD_15;
      if (uVar4 == 0xaa) {
        pQVar30 = *(QArrayData **)(event + 0x10);
        __s1_00 = *(QVariant **)(event + 0x18);
        lVar24 = *(long *)(event + 0x20);
        if (pQVar30 != (QArrayData *)0x0) {
          LOCK();
          (pQVar30->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar30->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        if (lVar24 == 0xd) {
          __s1 = __s1_00;
          if (__s1_00 == (QVariant *)0x0) {
            __s1 = (QVariant *)&QByteArray::_empty;
          }
          iVar16 = strncmp((char *)__s1,"_q_customDpi",0xc);
          if (iVar16 == 0) {
            QObject::property((char *)local_88.data);
            qVar15 = ::QVariant::toUInt((bool *)local_88.data);
            ::QVariant::~QVariant((QVariant *)&local_88);
            if ((this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>.
                _M_t.super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl == (QWExtra *)0x0) {
              QWidgetPrivate::createExtra(this_00);
            }
            uVar3 = (__s1_00->d).data.data[0xc];
            if (uVar3 == 'Y') {
              ((this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>.
               _M_t.super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
               super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->customDpiY = qVar15;
            }
            else if (uVar3 == 'X') {
              ((this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>.
               _M_t.super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
               super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->customDpiX = qVar15;
            }
            QWidgetPrivate::updateFont(this_00,&(this_00->data).fnt);
          }
        }
        lVar24 = *(long *)(*(long *)&this->field_0x8 + 0x78);
        if (((lVar24 != 0) && (lVar24 = *(long *)(lVar24 + 8), lVar24 != 0)) &&
           (pcVar12 = *(char **)(lVar24 + 0x20), pcVar12 != (char *)0x0)) {
          if (__s1_00 == (QVariant *)0x0) {
            __s1_00 = (QVariant *)&QByteArray::_empty;
          }
          iVar16 = strncmp((char *)__s1_00,"_q_platform_",0xc);
          if (iVar16 == 0) {
            QObject::property((char *)local_88.data);
            QObject::doSetProperty(pcVar12,__s1_00,(QVariant *)&local_88);
            ::QVariant::~QVariant((QVariant *)&local_88);
          }
        }
        if (pQVar30 != (QArrayData *)0x0) {
          LOCK();
          (pQVar30->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar30->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar30->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar30,1,0x10);
          }
        }
      }
      goto switchD_0030a44e_caseD_f;
    }
    goto switchD_0030a44e_caseD_33;
  }
  switch(uVar4) {
  case 2:
    (**(code **)(*(long *)this + 0x98))(this,event);
    break;
  case 3:
    (**(code **)(*(long *)this + 0xa0))(this,event);
    break;
  case 4:
    (**(code **)(*(long *)this + 0xa8))(this,event);
    break;
  case 5:
    (**(code **)(*(long *)this + 0xb0))(this,event);
    break;
  case 6:
    uVar23 = QKeyEvent::modifiers();
    if ((uVar23 & 0xc000000) == 0) {
      if (*(int *)(event + 0x40) == 0x1000002) {
LAB_0030b117:
        lVar24 = *(long *)this;
        uVar27 = 0;
      }
      else {
        if (*(int *)(event + 0x40) != 0x1000001) goto LAB_0030ac87;
        uVar18 = QKeyEvent::modifiers();
        if ((uVar18 >> 0x19 & 1) != 0) goto LAB_0030b117;
        if (*(int *)(event + 0x40) != 0x1000001) goto LAB_0030ac87;
        lVar24 = *(long *)this;
        uVar27 = 1;
      }
      cVar13 = (**(code **)(lVar24 + 0x198))(this,uVar27);
      if (cVar13 != '\0') break;
    }
LAB_0030ac87:
    (**(code **)(*(long *)this + 0xc0))(this,event);
    if (((event[0xc] == (QEvent)0x0) && (uVar18 = QKeyEvent::modifiers(), (uVar18 >> 0x19 & 1) != 0)
        ) && ((*(int *)(event + 0x40) == 0x1000030 && ((this_00->whatsThis).d.size != 0)))) {
      (**(code **)(*(long *)this + 400))(&local_88,this,2);
      auVar31 = ::QVariant::toRect();
      lVar26 = (long)auVar31._8_4_ + (long)auVar31._0_4_;
      lVar24 = (auVar31._8_8_ >> 0x20) + (auVar31._0_8_ >> 0x20);
      local_90 = (QPoint)((ulong)(lVar26 - (lVar26 >> 0x3f)) >> 1 & 0xffffffff |
                         (lVar24 - (lVar24 >> 0x3f) & 0xfffffffffffffffeU) << 0x1f);
      local_58.shared = (PrivateShared *)mapToGlobal(this,&local_90);
      QWhatsThis::showText((QPoint *)&local_58.shared,&this_00->whatsThis,this);
      ::QVariant::~QVariant((QVariant *)&local_88);
      event[0xc] = (QEvent)0x1;
    }
    break;
  case 7:
    (**(code **)(*(long *)this + 200))(this,event);
    break;
  case 8:
    (**(code **)(*(long *)this + 0xd0))(this,event);
    goto LAB_0030aebe;
  case 9:
    (**(code **)(*(long *)this + 0xd8))(this,event);
    break;
  case 10:
    if ((this_00->statusTip).d.size != 0) {
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      local_88._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
      local_88.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStatusTipEvent::QStatusTipEvent
                ((QStatusTipEvent *)local_88.data,(QString *)&this_00->statusTip);
      QCoreApplication::sendEvent(&this->super_QObject,(QEvent *)local_88.data);
      QStatusTipEvent::~QStatusTipEvent((QStatusTipEvent *)local_88.data);
    }
    (**(code **)(*(long *)this + 0xe0))(this,event);
    break;
  case 0xb:
    if ((this_00->statusTip).d.size != 0) {
      local_58.shared = (PrivateShared *)0x0;
      local_58._8_8_ = 0;
      local_58._16_8_ = 0;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      local_88._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
      local_88.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStatusTipEvent::QStatusTipEvent((QStatusTipEvent *)local_88.data,(QString *)local_58.data);
      QCoreApplication::sendEvent(&this->super_QObject,(QEvent *)local_88.data);
      QStatusTipEvent::~QStatusTipEvent((QStatusTipEvent *)local_88.data);
      if ((QPoint)local_58.shared != (QPoint)0x0) {
        LOCK();
        *(int *)local_58.shared = *(int *)local_58.shared + -1;
        UNLOCK();
        if (*(int *)local_58.shared == 0) {
          QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
        }
      }
    }
    (**(code **)(*(long *)this + 0xe8))(this,event);
    break;
  case 0xc:
    (**(code **)(*(long *)this + 0xf0))(this,event);
    break;
  case 0xd:
    (**(code **)(*(long *)this + 0xf8))(this,event);
    goto LAB_0030aebe;
  case 0xe:
    (**(code **)(*(long *)this + 0x100))(this,event);
LAB_0030aebe:
    QWidgetPrivate::updateWidgetTransform(this_00,event);
    break;
  case 0xf:
  case 0x10:
  case 0x14:
  case 0x16:
  case 0x17:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x20:
  case 0x22:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
  case 0x3a:
  case 0x3b:
  case 0x40:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x45:
  case 0x46:
  case 0x47:
  case 0x48:
  case 0x4c:
  case 0x50:
  case 0x51:
  case 0x54:
  case 0x55:
  case 0x56:
  case 0x5b:
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x6b:
  case 0x6c:
  case 0x70:
  case 0x74:
  case 0x75:
  case 0x76:
  case 0x77:
  case 0x79:
  case 0x7a:
  case 0x7c:
  case 0x7d:
  case 0x7e:
    goto switchD_0030a44e_caseD_f;
  case 0x11:
    (**(code **)(*(long *)this + 0x148))(this,event);
    break;
  case 0x12:
    (**(code **)(*(long *)this + 0x150))(this,event);
    break;
  case 0x13:
    (**(code **)(*(long *)this + 0x108))(this,event);
    break;
  case 0x15:
  case 0x21:
  case 0x27:
  case 0x58:
  case 0x61:
  case 0x62:
  case 99:
  case 100:
  case 0x65:
  case 0x66:
  case 0x6a:
  case 0x6d:
  case 0x78:
    goto switchD_0030a44e_caseD_15;
  case 0x18:
  case 0x19:
    if ((short)uVar18 < 0) {
      pQVar19 = palette(this);
      cVar13 = QPalette::isEqual((ColorGroup)pQVar19,Active);
      if (cVar13 == '\0') {
        update(this);
      }
    }
    pQVar30 = *(QArrayData **)&this_00->field_0x18;
    lVar24 = *(long *)&this_00->field_0x20;
    lVar26 = *(long *)&this_00->field_0x28;
    if (pQVar30 != (QArrayData *)0x0) {
      LOCK();
      (pQVar30->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar30->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (lVar26 != 0) {
      lVar29 = 0;
      do {
        pQVar8 = *(QObject **)(lVar24 + lVar29 * 8);
        if ((((pQVar8 != (QObject *)0x0) && ((*(byte *)(*(long *)(pQVar8 + 8) + 0x30) & 1) != 0)) &&
            ((*(byte *)(*(long *)(pQVar8 + 0x20) + 9) & 0x80) != 0)) &&
           ((*(byte *)(*(long *)(pQVar8 + 0x20) + 0xc) & 1) == 0)) {
          QCoreApplication::sendEvent(pQVar8,event);
        }
        lVar29 = lVar29 + 1;
      } while (lVar26 != lVar29);
    }
LAB_0030a70c:
    if (pQVar30 != (QArrayData *)0x0) {
      LOCK();
      (pQVar30->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar30->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar30->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar30,8,0x10);
      }
    }
    break;
  case 0x1f:
    (**(code **)(*(long *)this + 0xb8))(this,event);
    break;
  case 0x23:
    if ((((pQVar6->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
          super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) &&
       ((this_00->high_attributes[0] & 0x200000) == 0)) {
      QWidgetPrivate::setWindowIcon_sys(this_00);
      QWidgetPrivate::setWindowIcon_helper(this_00);
    }
    break;
  case 0x24:
    QWidgetPrivate::resolveFont(this_00);
    break;
  case 0x25:
    QWidgetPrivate::resolveLayoutDirection(this_00);
    break;
  case 0x26:
    if ((char)(pQVar6->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
              super_QFlagsStorage<Qt::WindowType>.i != '\x11') {
      QWidgetPrivate::resolvePalette(this_00);
    }
    break;
  case 0x33:
    break;
  case 0x3c:
    (**(code **)(*(long *)this + 0x128))(this,event);
    break;
  case 0x3d:
    (**(code **)(*(long *)this + 0x130))(this,event);
    break;
  case 0x3e:
    (**(code **)(*(long *)this + 0x138))(this,event);
    break;
  case 0x3f:
    (**(code **)(*(long *)this + 0x140))(this,event);
    break;
  case 0x49:
    if ((uVar18 >> 0x10 & 1) == 0) {
      QWidgetPrivate::show_sys(this_00);
    }
    break;
  case 0x4a:
    ensurePolished(this);
    break;
  case 0x4b:
    pQVar22 = style(this);
    (**(code **)(*(long *)pQVar22 + 0x60))(pQVar22,this);
    uVar18 = *(uint *)(*(long *)&this->field_0x8 + 0x244);
    if ((uVar18 & 4) == 0) {
      *(uint *)(*(long *)&this->field_0x8 + 0x244) = uVar18 | 4;
    }
    QApplication::font((QApplication *)&local_88,this);
    QApplication::font();
    cVar13 = QFont::isCopyOf((QFont *)local_88.data);
    QFont::~QFont((QFont *)local_58.data);
    QFont::~QFont((QFont *)local_88.data);
    if (cVar13 == '\0') {
      QWidgetPrivate::resolveFont(this_00);
    }
    QApplication::palette((QApplication *)&local_88,this);
    QGuiApplication::palette();
    cVar13 = QPalette::isCopyOf((QPalette *)&local_88);
    QPalette::~QPalette((QPalette *)&local_58);
    QPalette::~QPalette((QPalette *)&local_88);
    if (cVar13 == '\0') {
      QWidgetPrivate::resolvePalette(this_00);
    }
    goto LAB_0030aafb;
  case 0x4d:
    QWidgetPrivate::syncBackingStore(this_00);
    break;
  case 0x4e:
    update(this,(QRegion *)(event + 0x10));
    break;
  case 0x4f:
    QWidgetPrivate::createTLExtra(this_00);
    _Var11.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
    super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
    super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl =
         (((this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
           super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
           super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->topextra)._M_t.
         super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>;
    *(undefined8 *)
     ((long)_Var11.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
            super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
            super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0x90) = 0;
    *(undefined8 *)
     ((long)_Var11.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
            super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
            super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0x98) = 0;
    puVar2 = &this->data->field_0x10;
    *(uint *)puVar2 = *(uint *)puVar2 & 0xffffefff;
    break;
  case 0x52:
    switch(*(uint *)&pQVar6->field_0x10 >> 0xd & 7) {
    case 1:
      (**(code **)(*(long *)this + 0x110))(this,event);
      break;
    case 2:
      if ((this_00->actions).d.size != 0) {
        QMenu::exec(&this_00->actions,(QPoint *)(event + 0x30),(QAction *)0x0,this);
        break;
      }
      goto switchD_0030a4c6_caseD_c2;
    case 3:
      local_88._8_8_ = event + 0x28;
      local_88.shared = (PrivateShared *)0x0;
      QMetaObject::activate(&this->super_QObject,&staticMetaObject,3,&local_88.shared);
      break;
    case 4:
      break;
    default:
      goto switchD_0030a4c6_caseD_c2;
    }
    break;
  case 0x53:
    (**(code **)(*(long *)this + 0x188))(this,event);
    break;
  case 0x57:
    if ((*(int *)(event + 0x44) == 0) && ((this_00->high_attributes[3] & 2) == 0)) break;
  case 0x5c:
  case 0x5d:
    (**(code **)(*(long *)this + 0x118))(this,event);
    break;
  case 0x59:
    (**(code **)(*(long *)this + 0x160))(this,event);
    pQVar30 = *(QArrayData **)&this_00->field_0x18;
    lVar24 = *(long *)&this_00->field_0x20;
    lVar26 = *(long *)&this_00->field_0x28;
    if (pQVar30 != (QArrayData *)0x0) {
      LOCK();
      (pQVar30->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar30->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (lVar26 != 0) {
      lVar29 = 0;
      do {
        pQVar8 = *(QObject **)(lVar24 + lVar29 * 8);
        if (pQVar8 != (QObject *)0x0) {
          QCoreApplication::sendEvent(pQVar8,event);
        }
        lVar29 = lVar29 + 1;
      } while (lVar26 != lVar29);
    }
    if (pQVar30 != (QArrayData *)0x0) {
      LOCK();
      (pQVar30->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar30->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar30->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar30,8,0x10);
      }
    }
    update(this);
LAB_0030aafb:
    uVar14 = 1;
    break;
  case 0x5a:
    if (this_00->layout != (QLayout *)0x0) {
      (**(code **)(*(long *)this_00->layout + 0x70))();
    }
    update(this);
    goto switchD_0030a44e_caseD_15;
  case 0x67:
  case 0x68:
    if (*(long *)&this_00->field_0x28 != 0) {
      pQVar20 = QApplication::activeModalWidget();
      uVar23 = *(ulong *)&this_00->field_0x28;
      if (uVar23 != 0) {
        uVar25 = 0;
        do {
          pQVar7 = *(QWidget **)(*(long *)&this_00->field_0x20 + uVar25 * 8);
          if (((pQVar7 != pQVar20 && pQVar7 != (QWidget *)0x0) &&
              ((*(byte *)(*(long *)&pQVar7->field_0x8 + 0x30) & 1) != 0)) &&
             (((pQVar7->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
               super_QFlagsStorage<Qt::WindowType>.i & 1) == 0)) {
            QCoreApplication::sendEvent(&pQVar7->super_QObject,event);
            uVar23 = *(ulong *)&this_00->field_0x28;
          }
          uVar25 = uVar25 + 1;
        } while (uVar25 < uVar23);
      }
    }
    break;
  case 0x69:
    if (((byte)*(uint *)(event + 0x10) & 1) != (pQVar6->field_0x10 & 1)) {
      if ((*(uint *)(event + 0x10) & 1) == 0) {
        local_88.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
        local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QHideEvent::QHideEvent((QHideEvent *)local_88.data);
        QCoreApplication::sendSpontaneousEvent(&this->super_QObject,(QEvent *)local_88.data);
        QWidgetPrivate::hideChildren(this_00,true);
        this_00->field_0x253 = this_00->field_0x253 | 0x20;
        QHideEvent::~QHideEvent((QHideEvent *)local_88.data);
        uVar18 = *(uint *)&this_00->field_0x250;
      }
      else {
        uVar18 = *(uint *)&this_00->field_0x250;
        if ((uVar18 >> 0x1e & 1) == 0) {
          QWidgetPrivate::showChildren(this_00,true);
          local_88.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
          local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          QShowEvent::QShowEvent((QShowEvent *)local_88.data);
          QCoreApplication::sendSpontaneousEvent(&this->super_QObject,(QEvent *)local_88.data);
          QShowEvent::~QShowEvent((QShowEvent *)local_88.data);
          uVar18 = *(uint *)&this_00->field_0x250;
        }
        uVar18 = uVar18 & 0xdfffffff;
      }
      *(uint *)&this_00->field_0x250 = uVar18 & 0xbfffffff;
    }
switchD_0030a44e_caseD_15:
    (**(code **)(*(long *)this + 0x160))(this,event);
    break;
  case 0x6e:
    if ((this_00->toolTip).d.size != 0) {
      local_88.shared = (PrivateShared *)0x0;
      local_88._8_8_ = (QEvent *)0xffffffffffffffff;
      QToolTip::showText((QPoint *)(event + 0x18),&this_00->toolTip,this,(QRect *)&local_88,
                         this_00->toolTipDuration);
      break;
    }
    goto switchD_0030a4c6_caseD_c2;
  case 0x6f:
    if ((this_00->whatsThis).d.size != 0) {
      QWhatsThis::showText((QPoint *)(event + 0x18),&this_00->whatsThis,this);
      break;
    }
    goto switchD_0030a4c6_caseD_c2;
  case 0x71:
  case 0x72:
  case 0x73:
    (**(code **)(*(long *)this + 0x120))(this,event);
    break;
  case 0x7b:
    if ((this_00->whatsThis).d.size != 0) break;
switchD_0030a4c6_caseD_c2:
    event[0xc] = (QEvent)0x0;
    break;
  case 0x7f:
  case 0x80:
switchD_0030a44e_caseD_7f:
    update(this);
    break;
  default:
    if (uVar4 == 0xa9) {
      (**(code **)(*(long *)this + 0x160))(this,event);
      pQVar30 = *(QArrayData **)&this_00->field_0x18;
      lVar24 = *(long *)&this_00->field_0x20;
      lVar26 = *(long *)&this_00->field_0x28;
      if (pQVar30 != (QArrayData *)0x0) {
        LOCK();
        (pQVar30->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar30->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      if (lVar26 != 0) {
        lVar29 = 0;
        do {
          pQVar8 = *(QObject **)(lVar24 + lVar29 * 8);
          if (((pQVar8 != (QObject *)0x0) && ((*(byte *)(*(long *)(pQVar8 + 8) + 0x30) & 1) != 0))
             && (((*(byte *)(*(long *)(pQVar8 + 0x20) + 9) & 0x80) != 0 &&
                 ((*(byte *)(*(long *)(pQVar8 + 0x20) + 0xc) & 1) == 0)))) {
            QCoreApplication::sendEvent(pQVar8,event);
          }
          lVar29 = lVar29 + 1;
        } while (lVar26 != lVar29);
      }
      goto LAB_0030a70c;
    }
switchD_0030a44e_caseD_f:
    uVar14 = QObject::event((QEvent *)this);
  }
switchD_0030a44e_caseD_33:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (bool)uVar14;
}

Assistant:

bool QWidget::event(QEvent *event)
{
    Q_D(QWidget);

    // ignore mouse and key events when disabled
    if (!isEnabled()) {
        switch(event->type()) {
        case QEvent::TabletPress:
        case QEvent::TabletRelease:
        case QEvent::TabletMove:
        case QEvent::MouseButtonPress:
        case QEvent::MouseButtonRelease:
        case QEvent::MouseButtonDblClick:
        case QEvent::MouseMove:
        case QEvent::TouchBegin:
        case QEvent::TouchUpdate:
        case QEvent::TouchEnd:
        case QEvent::TouchCancel:
        case QEvent::ContextMenu:
        case QEvent::KeyPress:
        case QEvent::KeyRelease:
#if QT_CONFIG(wheelevent)
        case QEvent::Wheel:
#endif
            return false;
        default:
            break;
        }
    }
    switch (event->type()) {
    case QEvent::PlatformSurface: {
        // Sync up QWidget's view of whether or not the widget has been created
        switch (static_cast<QPlatformSurfaceEvent*>(event)->surfaceEventType()) {
        case QPlatformSurfaceEvent::SurfaceCreated:
            if (!testAttribute(Qt::WA_WState_Created))
                create();
            break;
        case QPlatformSurfaceEvent::SurfaceAboutToBeDestroyed:
            if (testAttribute(Qt::WA_WState_Created)) {
                // Child windows have already been destroyed by QWindow,
                // so we skip them here.
                destroy(false, false);
            }
            break;
        }
        break;
    }
    case QEvent::MouseMove:
        mouseMoveEvent((QMouseEvent*)event);
        break;

    case QEvent::MouseButtonPress:
        mousePressEvent((QMouseEvent*)event);
        break;

    case QEvent::MouseButtonRelease:
        mouseReleaseEvent((QMouseEvent*)event);
        break;

    case QEvent::MouseButtonDblClick:
        mouseDoubleClickEvent((QMouseEvent*)event);
        break;
#if QT_CONFIG(wheelevent)
    case QEvent::Wheel:
        wheelEvent((QWheelEvent*)event);
        break;
#endif
#if QT_CONFIG(tabletevent)
    case QEvent::TabletMove:
        if (static_cast<QTabletEvent *>(event)->buttons() == Qt::NoButton && !testAttribute(Qt::WA_TabletTracking))
            break;
        Q_FALLTHROUGH();
    case QEvent::TabletPress:
    case QEvent::TabletRelease:
        tabletEvent((QTabletEvent*)event);
        break;
#endif
    case QEvent::KeyPress: {
        QKeyEvent *k = static_cast<QKeyEvent *>(event);
        bool res = false;
        if (!(k->modifiers() & (Qt::ControlModifier | Qt::AltModifier))) {  //### Add MetaModifier?
            if (k->key() == Qt::Key_Backtab
                || (k->key() == Qt::Key_Tab && (k->modifiers() & Qt::ShiftModifier)))
                res = focusNextPrevChild(false);
            else if (k->key() == Qt::Key_Tab)
                res = focusNextPrevChild(true);
            if (res)
                break;
        }
        keyPressEvent(k);
#ifdef QT_KEYPAD_NAVIGATION
        if (!k->isAccepted() && QApplication::keypadNavigationEnabled()
            && !(k->modifiers() & (Qt::ControlModifier | Qt::AltModifier | Qt::ShiftModifier))) {
            if (QApplication::navigationMode() == Qt::NavigationModeKeypadTabOrder) {
                if (k->key() == Qt::Key_Up)
                    res = focusNextPrevChild(false);
                else if (k->key() == Qt::Key_Down)
                    res = focusNextPrevChild(true);
            } else if (QApplication::navigationMode() == Qt::NavigationModeKeypadDirectional) {
                if (k->key() == Qt::Key_Up)
                    res = QWidgetPrivate::navigateToDirection(QWidgetPrivate::DirectionNorth);
                else if (k->key() == Qt::Key_Right)
                    res = QWidgetPrivate::navigateToDirection(QWidgetPrivate::DirectionEast);
                else if (k->key() == Qt::Key_Down)
                    res = QWidgetPrivate::navigateToDirection(QWidgetPrivate::DirectionSouth);
                else if (k->key() == Qt::Key_Left)
                    res = QWidgetPrivate::navigateToDirection(QWidgetPrivate::DirectionWest);
            }
            if (res) {
                k->accept();
                break;
            }
        }
#endif
#if QT_CONFIG(whatsthis)
        if (!k->isAccepted()
            && k->modifiers() & Qt::ShiftModifier && k->key() == Qt::Key_F1
            && d->whatsThis.size()) {
            QWhatsThis::showText(mapToGlobal(inputMethodQuery(Qt::ImCursorRectangle).toRect().center()), d->whatsThis, this);
            k->accept();
        }
#endif
    }
        break;

    case QEvent::KeyRelease:
        keyReleaseEvent((QKeyEvent*)event);
        Q_FALLTHROUGH();
    case QEvent::ShortcutOverride:
        break;

    case QEvent::InputMethod:
        inputMethodEvent((QInputMethodEvent *) event);
        break;

    case QEvent::InputMethodQuery: {
            QInputMethodQueryEvent *query = static_cast<QInputMethodQueryEvent *>(event);
            Qt::InputMethodQueries queries = query->queries();
            for (uint i = 0; i < 32; ++i) {
                Qt::InputMethodQuery q = (Qt::InputMethodQuery)(int)(queries & (1<<i));
                if (q) {
                    QVariant v = inputMethodQuery(q);
                    if (q == Qt::ImEnabled && !v.isValid() && isEnabled()) {
                        // Qt:ImEnabled was added in Qt 5.3. So not all widgets support it, even
                        // if they implement IM otherwise (by overriding inputMethodQuery()). Instead
                        // they set the widget attribute Qt::WA_InputMethodEnabled. But this attribute
                        // will only be set if the widget supports IM _and_ is not read-only. So for
                        // read-only widgets, not all IM features will be supported when ImEnabled is
                        // not implemented explicitly (e.g selection handles for read-only widgets on iOS).
                        v = QVariant(testAttribute(Qt::WA_InputMethodEnabled));
                    }
                    query->setValue(q, v);
                }
            }
            query->accept();
        }
        break;

    case QEvent::PolishRequest:
        ensurePolished();
        break;

    case QEvent::Polish: {
        style()->polish(this);
        setAttribute(Qt::WA_WState_Polished);
        if (!QApplication::font(this).isCopyOf(QApplication::font()))
            d->resolveFont();
        if (!QApplication::palette(this).isCopyOf(QGuiApplication::palette()))
            d->resolvePalette();
    }
        break;

    case QEvent::ApplicationWindowIconChange:
        if (isWindow() && !testAttribute(Qt::WA_SetWindowIcon)) {
            d->setWindowIcon_sys();
            d->setWindowIcon_helper();
        }
        break;
    case QEvent::FocusIn:
        focusInEvent((QFocusEvent*)event);
        d->updateWidgetTransform(event);
        break;

    case QEvent::FocusOut:
        focusOutEvent((QFocusEvent*)event);
        break;

    case QEvent::Enter:
#if QT_CONFIG(statustip)
        if (d->statusTip.size()) {
            QStatusTipEvent tip(d->statusTip);
            QCoreApplication::sendEvent(const_cast<QWidget *>(this), &tip);
        }
#endif
        enterEvent(static_cast<QEnterEvent*>(event));
        break;

    case QEvent::Leave:
#if QT_CONFIG(statustip)
        if (d->statusTip.size()) {
            QString empty;
            QStatusTipEvent tip(empty);
            QCoreApplication::sendEvent(const_cast<QWidget *>(this), &tip);
        }
#endif
        leaveEvent(event);
        break;

    case QEvent::HoverEnter:
    case QEvent::HoverLeave:
        update();
        break;

    case QEvent::Paint:
        // At this point the event has to be delivered, regardless
        // whether the widget isVisible() or not because it
        // already went through the filters
        paintEvent((QPaintEvent*)event);
        break;

    case QEvent::Move:
        moveEvent((QMoveEvent*)event);
        d->updateWidgetTransform(event);
        break;

    case QEvent::Resize:
        resizeEvent((QResizeEvent*)event);
        d->updateWidgetTransform(event);
        break;

    case QEvent::Close:
        closeEvent((QCloseEvent *)event);
        break;

#ifndef QT_NO_CONTEXTMENU
    case QEvent::ContextMenu:
        switch (data->context_menu_policy) {
        case Qt::PreventContextMenu:
            break;
        case Qt::DefaultContextMenu:
            contextMenuEvent(static_cast<QContextMenuEvent *>(event));
            break;
        case Qt::CustomContextMenu:
            emit customContextMenuRequested(static_cast<QContextMenuEvent *>(event)->pos());
            break;
#if QT_CONFIG(menu)
        case Qt::ActionsContextMenu:
            if (d->actions.size()) {
                QMenu::exec(d->actions, static_cast<QContextMenuEvent *>(event)->globalPos(),
                            nullptr, this);
                break;
            }
            Q_FALLTHROUGH();
#endif
        default:
            event->ignore();
            break;
        }
        break;
#endif // QT_NO_CONTEXTMENU

#if QT_CONFIG(draganddrop)
    case QEvent::Drop:
        dropEvent((QDropEvent*) event);
        break;

    case QEvent::DragEnter:
        dragEnterEvent((QDragEnterEvent*) event);
        break;

    case QEvent::DragMove:
        dragMoveEvent((QDragMoveEvent*) event);
        break;

    case QEvent::DragLeave:
        dragLeaveEvent((QDragLeaveEvent*) event);
        break;
#endif

    case QEvent::Show:
        showEvent((QShowEvent*) event);
        break;

    case QEvent::Hide:
        hideEvent((QHideEvent*) event);
        break;

    case QEvent::ShowWindowRequest:
        if (!isHidden())
            d->show_sys();
        break;

    case QEvent::ApplicationFontChange:
        d->resolveFont();
        break;
    case QEvent::ApplicationPaletteChange:
        if (!(windowType() == Qt::Desktop))
            d->resolvePalette();
        break;

    case QEvent::ToolBarChange:
    case QEvent::ActivationChange:
    case QEvent::EnabledChange:
    case QEvent::FontChange:
    case QEvent::StyleChange:
    case QEvent::PaletteChange:
    case QEvent::WindowTitleChange:
    case QEvent::IconTextChange:
    case QEvent::ModifiedChange:
    case QEvent::MouseTrackingChange:
    case QEvent::TabletTrackingChange:
    case QEvent::ParentChange:
    case QEvent::LocaleChange:
    case QEvent::MacSizeChange:
    case QEvent::ContentsRectChange:
    case QEvent::ThemeChange:
    case QEvent::ReadOnlyChange:
        changeEvent(event);
        break;

    case QEvent::WindowStateChange: {
        const bool wasMinimized = static_cast<const QWindowStateChangeEvent *>(event)->oldState() & Qt::WindowMinimized;
        if (wasMinimized != isMinimized()) {
            QWidget *widget = const_cast<QWidget *>(this);
            if (wasMinimized) {
                // Always send the spontaneous events here, otherwise it can break the application!
                if (!d->childrenShownByExpose) {
                    // Show widgets only when they are not yet shown by the expose event
                    d->showChildren(true);
                    QShowEvent showEvent;
                    QCoreApplication::sendSpontaneousEvent(widget, &showEvent);
                }
                d->childrenHiddenByWState = false; // Set it always to "false" when window is restored
            } else {
                QHideEvent hideEvent;
                QCoreApplication::sendSpontaneousEvent(widget, &hideEvent);
                d->hideChildren(true);
                d->childrenHiddenByWState = true;
            }
            d->childrenShownByExpose = false; // Set it always to "false" when window state changes
        }
        changeEvent(event);
    }
        break;

    case QEvent::WindowActivate:
    case QEvent::WindowDeactivate: {
        if (isVisible() && !palette().isEqual(QPalette::Active, QPalette::Inactive))
            update();
        QList<QObject*> childList = d->children;
        for (int i = 0; i < childList.size(); ++i) {
            QWidget *w = qobject_cast<QWidget *>(childList.at(i));
            if (w && w->isVisible() && !w->isWindow())
                QCoreApplication::sendEvent(w, event);
        }
        break; }

    case QEvent::LanguageChange:
        changeEvent(event);
        {
            QList<QObject*> childList = d->children;
            for (int i = 0; i < childList.size(); ++i) {
                QObject *o = childList.at(i);
                if (o)
                    QCoreApplication::sendEvent(o, event);
            }
        }
        update();
        break;

    case QEvent::ApplicationLayoutDirectionChange:
        d->resolveLayoutDirection();
        break;

    case QEvent::LayoutDirectionChange:
        if (d->layout)
            d->layout->invalidate();
        update();
        changeEvent(event);
        break;
    case QEvent::UpdateRequest:
        d->syncBackingStore();
        break;
    case QEvent::UpdateLater:
        update(static_cast<QUpdateLaterEvent*>(event)->region());
        break;
    case QEvent::StyleAnimationUpdate:
        if (isVisible() && !window()->isMinimized()) {
            event->accept();
            update();
        }
        break;

    case QEvent::WindowBlocked:
    case QEvent::WindowUnblocked:
        if (!d->children.isEmpty()) {
            QWidget *modalWidget = QApplication::activeModalWidget();
            for (int i = 0; i < d->children.size(); ++i) {
                QObject *o = d->children.at(i);
                if (o && o != modalWidget && o->isWidgetType()) {
                    QWidget *w  = static_cast<QWidget *>(o);
                    // do not forward the event to child windows; QApplication does this for us
                    if (!w->isWindow())
                        QCoreApplication::sendEvent(w, event);
                }
            }
        }
        break;
#if QT_CONFIG(tooltip)
    case QEvent::ToolTip:
        if (!d->toolTip.isEmpty())
            QToolTip::showText(static_cast<QHelpEvent*>(event)->globalPos(), d->toolTip, this, QRect(), d->toolTipDuration);
        else
            event->ignore();
        break;
#endif
#if QT_CONFIG(whatsthis)
    case QEvent::WhatsThis:
        if (d->whatsThis.size())
            QWhatsThis::showText(static_cast<QHelpEvent *>(event)->globalPos(), d->whatsThis, this);
        else
            event->ignore();
        break;
    case QEvent::QueryWhatsThis:
        if (d->whatsThis.isEmpty())
            event->ignore();
        break;
#endif
    case QEvent::EmbeddingControl:
        d->topData()->frameStrut.setCoords(0 ,0, 0, 0);
        data->fstrut_dirty = false;
        break;
#ifndef QT_NO_ACTION
    case QEvent::ActionAdded:
    case QEvent::ActionRemoved:
    case QEvent::ActionChanged:
        actionEvent((QActionEvent*)event);
        break;
#endif

    case QEvent::KeyboardLayoutChange:
        {
            changeEvent(event);

            // inform children of the change
            QList<QObject*> childList = d->children;
            for (int i = 0; i < childList.size(); ++i) {
                QWidget *w = qobject_cast<QWidget *>(childList.at(i));
                if (w && w->isVisible() && !w->isWindow())
                    QCoreApplication::sendEvent(w, event);
            }
            break;
        }
    case QEvent::TouchBegin:
    case QEvent::TouchUpdate:
    case QEvent::TouchEnd:
    case QEvent::TouchCancel:
    {
        event->ignore();
        break;
    }
#ifndef QT_NO_GESTURES
    case QEvent::Gesture:
        event->ignore();
        break;
#endif
    case QEvent::ScreenChangeInternal:
        if (const QTLWExtra *te = d->maybeTopData()) {
            const QWindow *win = te->window;
            d->setWinId((win && win->handle()) ? win->handle()->winId() : 0);
        }
        break;
    case QEvent::DevicePixelRatioChange:
        if (d->data.fnt.d->dpi != logicalDpiY())
            d->updateFont(d->data.fnt);
        d->renderToTextureReallyDirty = 1;
        break;
    case QEvent::DynamicPropertyChange: {
        const QByteArray &propName = static_cast<QDynamicPropertyChangeEvent *>(event)->propertyName();
        if (propName.size() == 13 && !qstrncmp(propName, "_q_customDpi", 12)) {
            uint value = property(propName.constData()).toUInt();
            if (!d->extra)
                d->createExtra();
            const char axis = propName.at(12);
            if (axis == 'X')
                d->extra->customDpiX = value;
            else if (axis == 'Y')
                d->extra->customDpiY = value;
            d->updateFont(d->data.fnt);
        }
        if (windowHandle() && !qstrncmp(propName, "_q_platform_", 12))
            windowHandle()->setProperty(propName, property(propName));
        Q_FALLTHROUGH();
    }
    default:
        return QObject::event(event);
    }
    return true;
}